

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O2

void __thiscall Spi::flash_bulk_erase(Spi *this)

{
  undefined8 in_RAX;
  undefined7 uStack_18;
  uint8_t data [1];
  
  _uStack_18 = in_RAX;
  if (this->verbose == true) {
    fwrite("bulk erase..\n",0xd,1,_stdout);
  }
  _uStack_18 = CONCAT17(199,uStack_18);
  flash_chip_select(this);
  xfer_spi(this,data,1);
  flash_chip_deselect(this);
  return;
}

Assistant:

void Spi::flash_bulk_erase() {
	if (verbose)
		fprintf(stdout, "bulk erase..\n");

	uint8_t data[1] = { FC_CE };
	flash_chip_select();
	xfer_spi(data, 1);
	flash_chip_deselect();
}